

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O2

void crnlib::color::YCC_to_RGB(color_quad_u8 *rgb,color_quad_u8 *ycc,int cb_bias,int cr_bias)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uchar uVar4;
  int iVar5;
  
  bVar1 = (ycc->field_0).field_0.a;
  iVar2 = (uint)(ycc->field_0).field_0.r - cb_bias;
  iVar3 = (uint)(ycc->field_0).field_0.g - cr_bias;
  iVar5 = (iVar3 * 0x166e9 + 0x8000 >> 0x10) + (uint)bVar1;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  uVar4 = (uchar)iVar5;
  if (0xfe < iVar5) {
    uVar4 = 0xff;
  }
  (rgb->field_0).field_0.r = uVar4;
  iVar5 = (iVar2 * -0x581a + iVar3 * -0xb6d2 + 0x8000 >> 0x10) + (uint)bVar1;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  uVar4 = (uchar)iVar5;
  if (0xfe < iVar5) {
    uVar4 = 0xff;
  }
  (rgb->field_0).field_0.g = uVar4;
  iVar5 = (iVar2 * 0x1c5a2 + 0x8000 >> 0x10) + (uint)bVar1;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  uVar4 = (uchar)iVar5;
  if (0xfe < iVar5) {
    uVar4 = 0xff;
  }
  (rgb->field_0).field_0.b = uVar4;
  (rgb->field_0).field_0.a = 0xff;
  return;
}

Assistant:

inline void YCC_to_RGB(color_quad_u8& rgb, const color_quad_u8& ycc, int cb_bias = 123, int cr_bias = 125)
        {
            const int y = ycc.a;
            const int cb = ycc.r - cb_bias;
            const int cr = ycc.g - cr_bias;
            rgb.r = clamp_component(y + ((R_CR * cr + 32768) >> 16));
            rgb.g = clamp_component(y + ((G_CR * cr + G_CB * cb + 32768) >> 16));
            rgb.b = clamp_component(y + ((B_CB * cb + 32768) >> 16));
            rgb.a = 255;
        }